

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::strconv_escape(char_t *s,gap *g)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  size_t count;
  uint uVar4;
  ulong uVar5;
  char_t *pcVar6;
  undefined1 auVar7 [16];
  value_type local_18;
  
  bVar3 = s[1];
  local_18 = s + 1;
  if (0x66 < bVar3) {
    if (bVar3 == 0x67) {
      if (s[2] != 't') goto LAB_0010fe68;
      if (s[3] != ';') goto LAB_0010feed;
      *s = '>';
    }
    else {
      if (bVar3 != 0x6c) {
        if (bVar3 != 0x71) {
          return local_18;
        }
        if (s[2] != 'u') {
LAB_0010fe68:
          return s + 2;
        }
        if (s[3] != 'o') goto LAB_0010feed;
        if (s[4] != 't') goto LAB_0010ff19;
        if (s[5] != ';') goto LAB_0010ff39;
        *s = '\"';
        goto LAB_0010fedf;
      }
      if (s[2] != 't') goto LAB_0010fe68;
      if (s[3] != ';') goto LAB_0010feed;
      *s = '<';
    }
    pcVar6 = s + 4;
    count = 3;
    goto LAB_0010fe58;
  }
  if (bVar3 != 0x23) {
    if (bVar3 != 0x61) {
      return local_18;
    }
    if (s[2] != 'p') {
      if (s[2] != 'm') goto LAB_0010fe68;
      if (s[3] != 'p') goto LAB_0010feed;
      if (s[4] != ';') goto LAB_0010ff19;
      *s = '&';
      pcVar6 = s + 5;
      count = 4;
      goto LAB_0010fe58;
    }
    if (s[3] != 'o') {
LAB_0010feed:
      return s + 3;
    }
    if (s[4] != 's') {
LAB_0010ff19:
      return s + 4;
    }
    if (s[5] != ';') {
LAB_0010ff39:
      return s + 5;
    }
    *s = '\'';
LAB_0010fedf:
    pcVar6 = s + 6;
    count = 5;
    goto LAB_0010fe58;
  }
  bVar3 = s[2];
  pcVar6 = s + 2;
  if (bVar3 == 0x3b) {
    return pcVar6;
  }
  if (bVar3 == 0x78) {
    bVar3 = s[3];
    pcVar6 = s + 3;
    if (bVar3 == 0x3b) {
      return pcVar6;
    }
    uVar5 = 0;
    do {
      if (bVar3 - 0x30 < 10) {
        uVar4 = (int)uVar5 << 4 | bVar3 - 0x30;
      }
      else {
        uVar4 = bVar3 | 0x20;
        if (5 < uVar4 - 0x61) goto LAB_0010ff1f;
        uVar4 = (int)uVar5 * 0x10 + -0x57 + uVar4;
      }
      uVar5 = (ulong)uVar4;
      bVar3 = pcVar6[1];
      pcVar6 = pcVar6 + 1;
    } while( true );
  }
  uVar4 = bVar3 - 0x30;
  if (9 < uVar4) {
    return pcVar6;
  }
  uVar5 = 0;
  do {
    uVar5 = (ulong)(uVar4 + (int)uVar5 * 10);
    pbVar1 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
    uVar4 = *pbVar1 - 0x30;
  } while (uVar4 < 10);
  if (*pbVar1 != 0x3b) {
    return pcVar6;
  }
  goto LAB_0010ff24;
LAB_0010ff1f:
  if (bVar3 != 0x3b) {
    return pcVar6;
  }
LAB_0010ff24:
  pcVar6 = pcVar6 + 1;
  uVar4 = (uint)uVar5;
  if (uVar4 < 0x10000) {
    local_18 = utf8_writer::low(s,uVar4);
  }
  else {
    auVar7 = vpinsrb_avx(ZEXT416((uint)(uVar5 >> 0x12)),(uint)(uVar5 >> 0xc) & 0xfff3f,1);
    auVar7 = vpinsrb_avx(auVar7,(uint)(uVar5 >> 6) & 0x3ffff3f,2);
    auVar7 = vpinsrb_avx(auVar7,uVar4 & 0xffffff3f,3);
    auVar2._8_4_ = 0x808080f0;
    auVar2._0_8_ = 0x808080f0808080f0;
    auVar2._12_4_ = 0x808080f0;
    auVar7 = vpord_avx512vl(auVar7,auVar2);
    *(int *)s = auVar7._0_4_;
    local_18 = s + 4;
  }
  count = (long)pcVar6 - (long)local_18;
LAB_0010fe58:
  gap::push(g,&local_18,count);
  return pcVar6;
}

Assistant:

PUGI__FN char_t* strconv_escape(char_t* s, gap& g)
	{
		char_t* stre = s + 1;

		switch (*stre)
		{
			case '#':	// &#...
			{
				unsigned int ucsc = 0;

				if (stre[1] == 'x') // &#x... (hex code)
				{
					stre += 2;

					char_t ch = *stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 16 * ucsc + (ch - '0');
						else if (static_cast<unsigned int>((ch | ' ') - 'a') <= 5)
							ucsc = 16 * ucsc + ((ch | ' ') - 'a' + 10);
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}
				else	// &#... (dec code)
				{
					char_t ch = *++stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 10 * ucsc + (ch - '0');
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}

			#ifdef PUGIXML_WCHAR_MODE
				s = reinterpret_cast<char_t*>(wchar_writer::any(reinterpret_cast<wchar_writer::value_type>(s), ucsc));
			#else
				s = reinterpret_cast<char_t*>(utf8_writer::any(reinterpret_cast<uint8_t*>(s), ucsc));
			#endif

				g.push(s, stre - s);
				return stre;
			}

			case 'a':	// &a
			{
				++stre;

				if (*stre == 'm') // &am
				{
					if (*++stre == 'p' && *++stre == ';') // &amp;
					{
						*s++ = '&';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				else if (*stre == 'p') // &ap
				{
					if (*++stre == 'o' && *++stre == 's' && *++stre == ';') // &apos;
					{
						*s++ = '\'';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				break;
			}

			case 'g': // &g
			{
				if (*++stre == 't' && *++stre == ';') // &gt;
				{
					*s++ = '>';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'l': // &l
			{
				if (*++stre == 't' && *++stre == ';') // &lt;
				{
					*s++ = '<';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'q': // &q
			{
				if (*++stre == 'u' && *++stre == 'o' && *++stre == 't' && *++stre == ';') // &quot;
				{
					*s++ = '"';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			default:
				break;
		}

		return stre;
	}